

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_amount.cpp
# Opt level: O1

Amount cfd::core::operator-(Amount *amount,int64_t satoshi_amount)

{
  long lVar1;
  Amount AVar2;
  
  lVar1 = amount->amount_;
  Amount::CheckValidAmount(0x343ec8);
  Amount::CheckValidAmount(0x343ed0);
  Amount::CheckValidAmount(0x343edb);
  AVar2._8_8_ = 0;
  AVar2.amount_ = lVar1 - satoshi_amount;
  return AVar2;
}

Assistant:

Amount operator-(const Amount& amount, const int64_t satoshi_amount) {
  return Amount::CreateBySatoshiAmount(amount.GetSatoshiValue()) -=
         satoshi_amount;
}